

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void caffe::protobuf_caffe_2eproto::TableStruct::InitDefaultsImpl(void)

{
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined1 local_38;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  BlobShape::BlobShape((BlobShape *)&_BlobShape_default_instance_);
  DAT_00744110 = 1;
  BlobProto::BlobProto((BlobProto *)&_BlobProto_default_instance_);
  DAT_007441a8 = 1;
  BlobProtoVector::BlobProtoVector((BlobProtoVector *)&_BlobProtoVector_default_instance_);
  DAT_007441e0 = 1;
  Datum::Datum((Datum *)&_Datum_default_instance_);
  DAT_00744230 = 1;
  FillerParameter::_default_type__abi_cxx11_ = &DAT_00745900;
  DAT_007458f8 = 0;
  DAT_00745900._0_1_ = 0;
  DAT_00745910 = 1;
  local_40 = 0x746e6174736e6f63;
  local_48 = 8;
  local_38 = 0;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&FillerParameter::_default_type__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  FillerParameter::FillerParameter((FillerParameter *)&_FillerParameter_default_instance_);
  DAT_00744278 = 1;
  NetParameter::NetParameter((NetParameter *)&_NetParameter_default_instance_);
  DAT_00744320 = 1;
  SolverParameter::_default_regularization_type__abi_cxx11_ = &DAT_00745928;
  DAT_00745920 = 0;
  DAT_00745928._0_1_ = 0;
  DAT_00745938 = 1;
  local_48 = 2;
  local_40 = CONCAT53(local_40._3_5_,0x324c);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_regularization_type__abi_cxx11_,
             (string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  SolverParameter::_default_type__abi_cxx11_ = &DAT_00745950;
  DAT_00745948 = 0;
  DAT_00745950._0_1_ = 0;
  DAT_00745960 = 1;
  local_40 = CONCAT44(local_40._4_4_,0x444753);
  local_48 = 3;
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&SolverParameter::_default_type__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  SolverParameter::SolverParameter((SolverParameter *)&_SolverParameter_default_instance_);
  DAT_00744458 = 1;
  SolverState::SolverState((SolverState *)&_SolverState_default_instance_);
  DAT_007444a0 = 1;
  NetState::NetState((NetState *)&_NetState_default_instance_);
  DAT_007444e0 = 1;
  NetStateRule::NetStateRule((NetStateRule *)&_NetStateRule_default_instance_);
  DAT_00744540 = 1;
  ParamSpec::ParamSpec((ParamSpec *)&_ParamSpec_default_instance_);
  DAT_00744578 = 1;
  LayerParameter::LayerParameter((LayerParameter *)&_LayerParameter_default_instance_);
  DAT_007447d8 = 1;
  TransformationParameter::TransformationParameter
            ((TransformationParameter *)&_TransformationParameter_default_instance_);
  DAT_00744820 = 1;
  LossParameter::LossParameter((LossParameter *)&_LossParameter_default_instance_);
  DAT_00744850 = 1;
  AccuracyParameter::AccuracyParameter((AccuracyParameter *)&_AccuracyParameter_default_instance_);
  DAT_00744880 = 1;
  ArgMaxParameter::ArgMaxParameter((ArgMaxParameter *)&_ArgMaxParameter_default_instance_);
  DAT_007448b0 = 1;
  ConcatParameter::ConcatParameter((ConcatParameter *)&_ConcatParameter_default_instance_);
  DAT_007448d8 = 1;
  BatchNormParameter::BatchNormParameter
            ((BatchNormParameter *)&_BatchNormParameter_default_instance_);
  DAT_00744908 = 1;
  BiasParameter::BiasParameter((BiasParameter *)&_BiasParameter_default_instance_);
  DAT_00744938 = 1;
  ContrastiveLossParameter::ContrastiveLossParameter
            ((ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_);
  DAT_00744960 = 1;
  ConvolutionParameter::ConvolutionParameter
            ((ConvolutionParameter *)&_ConvolutionParameter_default_instance_);
  DAT_00744a00 = 1;
  CropParameter::CropParameter((CropParameter *)&_CropParameter_default_instance_);
  DAT_00744a38 = 1;
  DataParameter::DataParameter((DataParameter *)&_DataParameter_default_instance_);
  DAT_00744a88 = 1;
  DropoutParameter::DropoutParameter((DropoutParameter *)&_DropoutParameter_default_instance_);
  DAT_00744ab0 = 1;
  DummyDataParameter::DummyDataParameter
            ((DummyDataParameter *)&_DummyDataParameter_default_instance_);
  DAT_00744b40 = 1;
  EltwiseParameter::EltwiseParameter((EltwiseParameter *)&_EltwiseParameter_default_instance_);
  DAT_00744b78 = 1;
  ELUParameter::ELUParameter((ELUParameter *)&_ELUParameter_default_instance_);
  DAT_00744ba0 = 1;
  EmbedParameter::EmbedParameter((EmbedParameter *)&_EmbedParameter_default_instance_);
  DAT_00744be0 = 1;
  ExpParameter::ExpParameter((ExpParameter *)&_ExpParameter_default_instance_);
  DAT_00744c10 = 1;
  FlattenParameter::FlattenParameter((FlattenParameter *)&_FlattenParameter_default_instance_);
  DAT_00744c38 = 1;
  HDF5DataParameter::HDF5DataParameter((HDF5DataParameter *)&_HDF5DataParameter_default_instance_);
  DAT_00744c68 = 1;
  HDF5OutputParameter::HDF5OutputParameter
            ((HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_);
  DAT_00744c90 = 1;
  HingeLossParameter::HingeLossParameter
            ((HingeLossParameter *)&_HingeLossParameter_default_instance_);
  DAT_00744cb8 = 1;
  ImageDataParameter::ImageDataParameter
            ((ImageDataParameter *)&_ImageDataParameter_default_instance_);
  DAT_00744d10 = 1;
  InfogainLossParameter::InfogainLossParameter
            ((InfogainLossParameter *)&_InfogainLossParameter_default_instance_);
  DAT_00744d38 = 1;
  InnerProductParameter::InnerProductParameter
            ((InnerProductParameter *)&_InnerProductParameter_default_instance_);
  DAT_00744d78 = 1;
  InputParameter::InputParameter((InputParameter *)&_InputParameter_default_instance_);
  DAT_00744db0 = 1;
  LogParameter::LogParameter((LogParameter *)&_LogParameter_default_instance_);
  DAT_00744de0 = 1;
  LRNParameter::LRNParameter((LRNParameter *)&_LRNParameter_default_instance_);
  DAT_00744e18 = 1;
  MemoryDataParameter::MemoryDataParameter
            ((MemoryDataParameter *)&_MemoryDataParameter_default_instance_);
  DAT_00744e48 = 1;
  MVNParameter::MVNParameter((MVNParameter *)&_MVNParameter_default_instance_);
  DAT_00744e70 = 1;
  ParameterParameter::ParameterParameter
            ((ParameterParameter *)&_ParameterParameter_default_instance_);
  DAT_00744e98 = 1;
  PoolingParameter::PoolingParameter((PoolingParameter *)&_PoolingParameter_default_instance_);
  DAT_00744ee8 = 1;
  PowerParameter::PowerParameter((PowerParameter *)&_PowerParameter_default_instance_);
  DAT_00744f18 = 1;
  PythonParameter::PythonParameter((PythonParameter *)&_PythonParameter_default_instance_);
  DAT_00744f58 = 1;
  RecurrentParameter::RecurrentParameter
            ((RecurrentParameter *)&_RecurrentParameter_default_instance_);
  DAT_00744f90 = 1;
  ReductionParameter::ReductionParameter
            ((ReductionParameter *)&_ReductionParameter_default_instance_);
  DAT_00744fc0 = 1;
  ReLUParameter::ReLUParameter((ReLUParameter *)&_ReLUParameter_default_instance_);
  DAT_00744fe8 = 1;
  ReshapeParameter::ReshapeParameter((ReshapeParameter *)&_ReshapeParameter_default_instance_);
  DAT_00745018 = 1;
  ScaleParameter::ScaleParameter((ScaleParameter *)&_ScaleParameter_default_instance_);
  DAT_00745058 = 1;
  SigmoidParameter::SigmoidParameter((SigmoidParameter *)&_SigmoidParameter_default_instance_);
  DAT_00745080 = 1;
  SliceParameter::SliceParameter((SliceParameter *)&_SliceParameter_default_instance_);
  DAT_007450b8 = 1;
  SoftmaxParameter::SoftmaxParameter((SoftmaxParameter *)&_SoftmaxParameter_default_instance_);
  DAT_007450e0 = 1;
  TanHParameter::TanHParameter((TanHParameter *)&_TanHParameter_default_instance_);
  DAT_00745108 = 1;
  TileParameter::TileParameter((TileParameter *)&_TileParameter_default_instance_);
  DAT_00745130 = 1;
  ThresholdParameter::ThresholdParameter
            ((ThresholdParameter *)&_ThresholdParameter_default_instance_);
  DAT_00745158 = 1;
  WindowDataParameter::_default_crop_mode__abi_cxx11_ = &DAT_00745978;
  DAT_00745970 = 0;
  DAT_00745978._0_1_ = 0;
  DAT_00745988 = 1;
  local_48 = 4;
  local_40 = CONCAT35(local_40._5_3_,0x70726177);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&WindowDataParameter::_default_crop_mode__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  WindowDataParameter::WindowDataParameter
            ((WindowDataParameter *)&_WindowDataParameter_default_instance_);
  DAT_007451b8 = 1;
  SPPParameter::SPPParameter((SPPParameter *)&_SPPParameter_default_instance_);
  DAT_007451e8 = 1;
  V1LayerParameter::V1LayerParameter((V1LayerParameter *)&_V1LayerParameter_default_instance_);
  DAT_007453e0 = 1;
  V0LayerParameter::_default_det_crop_mode__abi_cxx11_ = &DAT_007459a0;
  DAT_00745998 = 0;
  DAT_007459a0._0_1_ = 0;
  DAT_007459b0 = 1;
  local_48 = 4;
  local_40 = CONCAT35(local_40._5_3_,0x70726177);
  local_50 = &local_40;
  std::__cxx11::string::operator=
            ((string *)&V0LayerParameter::_default_det_crop_mode__abi_cxx11_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  V0LayerParameter::V0LayerParameter((V0LayerParameter *)&_V0LayerParameter_default_instance_);
  DAT_007454e8 = 1;
  PReLUParameter::PReLUParameter((PReLUParameter *)&_PReLUParameter_default_instance_);
  _DAT_00744310 = &_NetState_default_instance_;
  _DAT_007443e0 = &_NetParameter_default_instance_;
  _DAT_007443d8 = &_NetParameter_default_instance_;
  _DAT_007443e8 = &_NetState_default_instance_;
  _DAT_00744190 = &_BlobShape_default_instance_;
  _DAT_00744658 = &_TransformationParameter_default_instance_;
  _DAT_00744660 = &_LossParameter_default_instance_;
  _DAT_00744668 = &_AccuracyParameter_default_instance_;
  _DAT_00744670 = &_ArgMaxParameter_default_instance_;
  _DAT_00744790 = &_BatchNormParameter_default_instance_;
  _DAT_007447a0 = &_BiasParameter_default_instance_;
  _DAT_00744678 = &_ConcatParameter_default_instance_;
  _DAT_00744680 = &_ContrastiveLossParameter_default_instance_;
  _DAT_00744688 = &_ConvolutionParameter_default_instance_;
  _DAT_007447b8 = &_CropParameter_default_instance_;
  _DAT_00744690 = &_DataParameter_default_instance_;
  _DAT_00744698 = &_DropoutParameter_default_instance_;
  _DAT_007446a0 = &_DummyDataParameter_default_instance_;
  _DAT_007446a8 = &_EltwiseParameter_default_instance_;
  _DAT_00744798 = &_ELUParameter_default_instance_;
  _DAT_00744780 = &_EmbedParameter_default_instance_;
  _DAT_007446b0 = &_ExpParameter_default_instance_;
  _DAT_00744770 = &_FlattenParameter_default_instance_;
  _DAT_007446b8 = &_HDF5DataParameter_default_instance_;
  _DAT_007446c0 = &_HDF5OutputParameter_default_instance_;
  _DAT_007446c8 = &_HingeLossParameter_default_instance_;
  _DAT_007446d0 = &_ImageDataParameter_default_instance_;
  _DAT_007446d8 = &_InfogainLossParameter_default_instance_;
  _DAT_007446e0 = &_InnerProductParameter_default_instance_;
  _DAT_007447b0 = &_InputParameter_default_instance_;
  _DAT_00744768 = &_LogParameter_default_instance_;
  _DAT_007446e8 = &_LRNParameter_default_instance_;
  _DAT_007446f0 = &_MemoryDataParameter_default_instance_;
  _DAT_007446f8 = &_MVNParameter_default_instance_;
  _DAT_007447c0 = &_ParameterParameter_default_instance_;
  _DAT_00744700 = &_PoolingParameter_default_instance_;
  _DAT_00744708 = &_PowerParameter_default_instance_;
  _DAT_00744750 = &_PReLUParameter_default_instance_;
  _DAT_00744748 = &_PythonParameter_default_instance_;
  _DAT_007447c8 = &_RecurrentParameter_default_instance_;
  _DAT_00744778 = &_ReductionParameter_default_instance_;
  DAT_00744e90 = &_BlobShape_default_instance_;
  DAT_00745008 = &_BlobShape_default_instance_;
  _DAT_00744710 = &_ReLUParameter_default_instance_;
  _DAT_00744760 = &_ReshapeParameter_default_instance_;
  _DAT_007447a8 = &_ScaleParameter_default_instance_;
  _DAT_00744718 = &_SigmoidParameter_default_instance_;
  _DAT_00744720 = &_SoftmaxParameter_default_instance_;
  _DAT_00744758 = &_SPPParameter_default_instance_;
  _DAT_00744728 = &_SliceParameter_default_instance_;
  _DAT_00744730 = &_TanHParameter_default_instance_;
  _DAT_00744738 = &_ThresholdParameter_default_instance_;
  _DAT_00744788 = &_TileParameter_default_instance_;
  _DAT_00744740 = &_WindowDataParameter_default_instance_;
  _DAT_00745378 = &_AccuracyParameter_default_instance_;
  _DAT_00745358 = &_ArgMaxParameter_default_instance_;
  _DAT_007452e8 = &_ConcatParameter_default_instance_;
  _DAT_007453c0 = &_ContrastiveLossParameter_default_instance_;
  _DAT_007452f0 = &_ConvolutionParameter_default_instance_;
  _DAT_007452f8 = &_DataParameter_default_instance_;
  _DAT_00745300 = &_DropoutParameter_default_instance_;
  _DAT_00745370 = &_DummyDataParameter_default_instance_;
  _DAT_00745360 = &_EltwiseParameter_default_instance_;
  _DAT_007453c8 = &_ExpParameter_default_instance_;
  _DAT_00745308 = &_HDF5DataParameter_default_instance_;
  _DAT_00745310 = &_HDF5OutputParameter_default_instance_;
  _DAT_00745380 = &_HingeLossParameter_default_instance_;
  _DAT_00745318 = &_ImageDataParameter_default_instance_;
  _DAT_00745320 = &_InfogainLossParameter_default_instance_;
  _DAT_00745328 = &_InnerProductParameter_default_instance_;
  _DAT_00745330 = &_LRNParameter_default_instance_;
  _DAT_00745350 = &_MemoryDataParameter_default_instance_;
  _DAT_00745398 = &_MVNParameter_default_instance_;
  _DAT_00745338 = &_PoolingParameter_default_instance_;
  _DAT_00745348 = &_PowerParameter_default_instance_;
  _DAT_00745388 = &_ReLUParameter_default_instance_;
  _DAT_007453b0 = &_SigmoidParameter_default_instance_;
  _DAT_007453b8 = &_SoftmaxParameter_default_instance_;
  _DAT_00745390 = &_SliceParameter_default_instance_;
  _DAT_007453a8 = &_TanHParameter_default_instance_;
  _DAT_00745368 = &_ThresholdParameter_default_instance_;
  _DAT_00745340 = &_WindowDataParameter_default_instance_;
  _DAT_007453a0 = &_TransformationParameter_default_instance_;
  _DAT_007453d0 = &_LossParameter_default_instance_;
  _DAT_007452e0 = &_V0LayerParameter_default_instance_;
  DAT_00745460 = &_FillerParameter_default_instance_;
  DAT_00745468 = &_FillerParameter_default_instance_;
  DAT_00745470 = &_HDF5OutputParameter_default_instance_;
  _DAT_00744928 = &_FillerParameter_default_instance_;
  _DAT_007449c0 = &_FillerParameter_default_instance_;
  _DAT_007449c8 = &_FillerParameter_default_instance_;
  _DAT_00744bc0 = &_FillerParameter_default_instance_;
  _DAT_00744bc8 = &_FillerParameter_default_instance_;
  _DAT_00744d58 = &_FillerParameter_default_instance_;
  _DAT_00744d60 = &_FillerParameter_default_instance_;
  _DAT_00744f78 = &_FillerParameter_default_instance_;
  _DAT_00744f80 = &_FillerParameter_default_instance_;
  _DAT_00745038 = &_FillerParameter_default_instance_;
  _DAT_00745040 = &_FillerParameter_default_instance_;
  DAT_00745518 = 1;
  _DAT_00745508 = &_FillerParameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BlobShape_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.DefaultConstruct();
  _BlobProtoVector_default_instance_.DefaultConstruct();
  _Datum_default_instance_.DefaultConstruct();
  FillerParameter::_default_type_.DefaultConstruct();
  *FillerParameter::_default_type_.get_mutable() = ::std::string("constant", 8);
  _FillerParameter_default_instance_.DefaultConstruct();
  _NetParameter_default_instance_.DefaultConstruct();
  SolverParameter::_default_regularization_type_.DefaultConstruct();
  *SolverParameter::_default_regularization_type_.get_mutable() = ::std::string("L2", 2);
  SolverParameter::_default_type_.DefaultConstruct();
  *SolverParameter::_default_type_.get_mutable() = ::std::string("SGD", 3);
  _SolverParameter_default_instance_.DefaultConstruct();
  _SolverState_default_instance_.DefaultConstruct();
  _NetState_default_instance_.DefaultConstruct();
  _NetStateRule_default_instance_.DefaultConstruct();
  _ParamSpec_default_instance_.DefaultConstruct();
  _LayerParameter_default_instance_.DefaultConstruct();
  _TransformationParameter_default_instance_.DefaultConstruct();
  _LossParameter_default_instance_.DefaultConstruct();
  _AccuracyParameter_default_instance_.DefaultConstruct();
  _ArgMaxParameter_default_instance_.DefaultConstruct();
  _ConcatParameter_default_instance_.DefaultConstruct();
  _BatchNormParameter_default_instance_.DefaultConstruct();
  _BiasParameter_default_instance_.DefaultConstruct();
  _ContrastiveLossParameter_default_instance_.DefaultConstruct();
  _ConvolutionParameter_default_instance_.DefaultConstruct();
  _CropParameter_default_instance_.DefaultConstruct();
  _DataParameter_default_instance_.DefaultConstruct();
  _DropoutParameter_default_instance_.DefaultConstruct();
  _DummyDataParameter_default_instance_.DefaultConstruct();
  _EltwiseParameter_default_instance_.DefaultConstruct();
  _ELUParameter_default_instance_.DefaultConstruct();
  _EmbedParameter_default_instance_.DefaultConstruct();
  _ExpParameter_default_instance_.DefaultConstruct();
  _FlattenParameter_default_instance_.DefaultConstruct();
  _HDF5DataParameter_default_instance_.DefaultConstruct();
  _HDF5OutputParameter_default_instance_.DefaultConstruct();
  _HingeLossParameter_default_instance_.DefaultConstruct();
  _ImageDataParameter_default_instance_.DefaultConstruct();
  _InfogainLossParameter_default_instance_.DefaultConstruct();
  _InnerProductParameter_default_instance_.DefaultConstruct();
  _InputParameter_default_instance_.DefaultConstruct();
  _LogParameter_default_instance_.DefaultConstruct();
  _LRNParameter_default_instance_.DefaultConstruct();
  _MemoryDataParameter_default_instance_.DefaultConstruct();
  _MVNParameter_default_instance_.DefaultConstruct();
  _ParameterParameter_default_instance_.DefaultConstruct();
  _PoolingParameter_default_instance_.DefaultConstruct();
  _PowerParameter_default_instance_.DefaultConstruct();
  _PythonParameter_default_instance_.DefaultConstruct();
  _RecurrentParameter_default_instance_.DefaultConstruct();
  _ReductionParameter_default_instance_.DefaultConstruct();
  _ReLUParameter_default_instance_.DefaultConstruct();
  _ReshapeParameter_default_instance_.DefaultConstruct();
  _ScaleParameter_default_instance_.DefaultConstruct();
  _SigmoidParameter_default_instance_.DefaultConstruct();
  _SliceParameter_default_instance_.DefaultConstruct();
  _SoftmaxParameter_default_instance_.DefaultConstruct();
  _TanHParameter_default_instance_.DefaultConstruct();
  _TileParameter_default_instance_.DefaultConstruct();
  _ThresholdParameter_default_instance_.DefaultConstruct();
  WindowDataParameter::_default_crop_mode_.DefaultConstruct();
  *WindowDataParameter::_default_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _WindowDataParameter_default_instance_.DefaultConstruct();
  _SPPParameter_default_instance_.DefaultConstruct();
  _V1LayerParameter_default_instance_.DefaultConstruct();
  V0LayerParameter::_default_det_crop_mode_.DefaultConstruct();
  *V0LayerParameter::_default_det_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _V0LayerParameter_default_instance_.DefaultConstruct();
  _PReLUParameter_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _NetParameter_default_instance_.get_mutable()->state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->batch_norm_param_ = const_cast< ::caffe::BatchNormParameter*>(
      ::caffe::BatchNormParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->bias_param_ = const_cast< ::caffe::BiasParameter*>(
      ::caffe::BiasParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->crop_param_ = const_cast< ::caffe::CropParameter*>(
      ::caffe::CropParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->elu_param_ = const_cast< ::caffe::ELUParameter*>(
      ::caffe::ELUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->embed_param_ = const_cast< ::caffe::EmbedParameter*>(
      ::caffe::EmbedParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->flatten_param_ = const_cast< ::caffe::FlattenParameter*>(
      ::caffe::FlattenParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->input_param_ = const_cast< ::caffe::InputParameter*>(
      ::caffe::InputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->log_param_ = const_cast< ::caffe::LogParameter*>(
      ::caffe::LogParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->parameter_param_ = const_cast< ::caffe::ParameterParameter*>(
      ::caffe::ParameterParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->prelu_param_ = const_cast< ::caffe::PReLUParameter*>(
      ::caffe::PReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->python_param_ = const_cast< ::caffe::PythonParameter*>(
      ::caffe::PythonParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->recurrent_param_ = const_cast< ::caffe::RecurrentParameter*>(
      ::caffe::RecurrentParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reduction_param_ = const_cast< ::caffe::ReductionParameter*>(
      ::caffe::ReductionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reshape_param_ = const_cast< ::caffe::ReshapeParameter*>(
      ::caffe::ReshapeParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->scale_param_ = const_cast< ::caffe::ScaleParameter*>(
      ::caffe::ScaleParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->spp_param_ = const_cast< ::caffe::SPPParameter*>(
      ::caffe::SPPParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tile_param_ = const_cast< ::caffe::TileParameter*>(
      ::caffe::TileParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _BiasParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ParameterParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ReshapeParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->layer_ = const_cast< ::caffe::V0LayerParameter*>(
      ::caffe::V0LayerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _PReLUParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
}